

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeNext_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  Fts5ExprPhrase *pFVar1;
  long lVar2;
  Fts5IndexIter *pIndexIter;
  i64 iVar3;
  bool local_5a;
  bool local_59;
  Fts5IndexIter *pIter;
  i64 ii;
  i64 iRowid;
  Fts5ExprTerm *p;
  int bEof;
  int rc;
  Fts5ExprTerm *pTerm;
  i64 iFrom_local;
  int bFromValid_local;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  pFVar1 = pNode->pNear->apPhrase[0];
  iRowid = (i64)pFVar1->aTerm;
  p._4_4_ = 0;
  pNode->bNomatch = 0;
  if (pFVar1->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    pIndexIter = pFVar1->aTerm[0].pIter;
    if (bFromValid == 0) {
      p._4_4_ = sqlite3Fts5IterNext(pIndexIter);
    }
    else {
      p._4_4_ = sqlite3Fts5IterNextFrom(pIndexIter,iFrom);
    }
    local_5a = true;
    if (p._4_4_ == 0) {
      local_5a = pIndexIter->bEof != '\0';
    }
    pNode->bEof = (uint)local_5a;
  }
  else {
    local_59 = true;
    iVar3 = fts5ExprSynonymRowid((Fts5ExprTerm *)iRowid,pExpr->bDesc,(int *)0x0);
    for (; iRowid != 0; iRowid = *(i64 *)(iRowid + 0x18)) {
      if (*(char *)(*(long *)(iRowid + 0x10) + 0x14) == '\0') {
        lVar2 = **(long **)(iRowid + 0x10);
        if ((lVar2 == iVar3) ||
           (((bFromValid != 0 && (lVar2 != iFrom)) && ((uint)(iFrom < lVar2) == pExpr->bDesc)))) {
          if (bFromValid == 0) {
            p._4_4_ = sqlite3Fts5IterNext(*(Fts5IndexIter **)(iRowid + 0x10));
          }
          else {
            p._4_4_ = sqlite3Fts5IterNextFrom(*(Fts5IndexIter **)(iRowid + 0x10),iFrom);
          }
          if (p._4_4_ != 0) break;
          if (*(char *)(*(long *)(iRowid + 0x10) + 0x14) == '\0') {
            local_59 = false;
          }
        }
        else {
          local_59 = false;
        }
      }
    }
    local_59 = p._4_4_ != 0 || local_59;
    pNode->bEof = (uint)local_59;
  }
  if (pNode->bEof == 0) {
    p._4_4_ = fts5ExprNodeTest_STRING(pExpr,pNode);
  }
  return p._4_4_;
}

Assistant:

static int fts5ExprNodeNext_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode,            /* FTS5_STRING or FTS5_TERM node */
  int bFromValid,
  i64 iFrom 
){
  Fts5ExprTerm *pTerm = &pNode->pNear->apPhrase[0]->aTerm[0];
  int rc = SQLITE_OK;

  pNode->bNomatch = 0;
  if( pTerm->pSynonym ){
    int bEof = 1;
    Fts5ExprTerm *p;

    /* Find the firstest rowid any synonym points to. */
    i64 iRowid = fts5ExprSynonymRowid(pTerm, pExpr->bDesc, 0);

    /* Advance each iterator that currently points to iRowid. Or, if iFrom
    ** is valid - each iterator that points to a rowid before iFrom.  */
    for(p=pTerm; p; p=p->pSynonym){
      if( sqlite3Fts5IterEof(p->pIter)==0 ){
        i64 ii = p->pIter->iRowid;
        if( ii==iRowid 
         || (bFromValid && ii!=iFrom && (ii>iFrom)==pExpr->bDesc) 
        ){
          if( bFromValid ){
            rc = sqlite3Fts5IterNextFrom(p->pIter, iFrom);
          }else{
            rc = sqlite3Fts5IterNext(p->pIter);
          }
          if( rc!=SQLITE_OK ) break;
          if( sqlite3Fts5IterEof(p->pIter)==0 ){
            bEof = 0;
          }
        }else{
          bEof = 0;
        }
      }
    }

    /* Set the EOF flag if either all synonym iterators are at EOF or an
    ** error has occurred.  */
    pNode->bEof = (rc || bEof);
  }else{
    Fts5IndexIter *pIter = pTerm->pIter;

    assert( Fts5NodeIsString(pNode) );
    if( bFromValid ){
      rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
    }else{
      rc = sqlite3Fts5IterNext(pIter);
    }

    pNode->bEof = (rc || sqlite3Fts5IterEof(pIter));
  }

  if( pNode->bEof==0 ){
    assert( rc==SQLITE_OK );
    rc = fts5ExprNodeTest_STRING(pExpr, pNode);
  }

  return rc;
}